

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_write.c
# Opt level: O0

void write_row_start(xlsxiowriter handle,char *rowattr)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char *local_78;
  char *local_58;
  char *local_40;
  char *local_28;
  char *rowattr_local;
  xlsxiowriter handle_local;
  
  handle->rownr = handle->rownr + 1;
  handle->colnr = 0;
  if (handle->sheetopen == 0) {
    if (handle->rowheight == 0) {
      local_58 = rowattr;
      if (rowattr == (char *)0x0) {
        local_58 = "";
      }
      append_data(&handle->buf,&handle->buflen,"<row%s r=\"%lu\">",local_58,handle->rownr);
    }
    else {
      sVar1 = handle->rowheight;
      auVar3._8_4_ = (int)(sVar1 >> 0x20);
      auVar3._0_8_ = sVar1;
      auVar3._12_4_ = 0x45300000;
      local_78 = rowattr;
      if (rowattr == (char *)0x0) {
        local_78 = "";
      }
      append_data(&handle->buf,&handle->buflen,"<row ht=\"%.6G\" customHeight=\"1\"%s r=\"%lu\">",
                  ((auVar3._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 12.75,local_78,
                  handle->rownr);
    }
  }
  else if (handle->rowheight == 0) {
    local_28 = rowattr;
    if (rowattr == (char *)0x0) {
      local_28 = "";
    }
    fprintf((FILE *)handle->pipe_write,"<row%s r=\"%lu\">",local_28,handle->rownr);
  }
  else {
    sVar1 = handle->rowheight;
    auVar2._8_4_ = (int)(sVar1 >> 0x20);
    auVar2._0_8_ = sVar1;
    auVar2._12_4_ = 0x45300000;
    local_40 = rowattr;
    if (rowattr == (char *)0x0) {
      local_40 = "";
    }
    fprintf((FILE *)handle->pipe_write,"<row ht=\"%.6G\" customHeight=\"1\"%s r=\"%lu\">",
            ((auVar2._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 12.75,local_40,
            handle->rownr);
  }
  handle->rowopen = 1;
  return;
}

Assistant:

void write_row_start (xlsxiowriter handle, const char* rowattr)
{
#ifndef NO_ROW_NUMBERS
  handle->rownr++;
#ifndef NO_COLUMN_NUMBERS
  handle->colnr = 0;
#endif
#endif
  if (handle->sheetopen) {
    if (!handle->rowheight)
      fprintf(handle->pipe_write, "<row%s" ROWNRTAG ">", (rowattr ? rowattr : "") ROWNRPARAM(handle));
    else
      fprintf(handle->pipe_write, "<row ht=\"%.6G\" customHeight=\"1\"%s" ROWNRTAG ">", CALCULATE_COLUMN_HEIGHT(handle->rowheight), (rowattr ? rowattr : "") ROWNRPARAM(handle));
  } else {
    if (!handle->rowheight)
      append_data(&handle->buf, &handle->buflen, "<row%s" ROWNRTAG ">", (rowattr ? rowattr : "") ROWNRPARAM(handle));
    else
      append_data(&handle->buf, &handle->buflen, "<row ht=\"%.6G\" customHeight=\"1\"%s" ROWNRTAG ">",  CALCULATE_COLUMN_HEIGHT(handle->rowheight), (rowattr ? rowattr : "") ROWNRPARAM(handle));
  }
  handle->rowopen = 1;
}